

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O1

int TVMStreamCreate(int device_type,int device_id,TVMStreamHandle *out)

{
  int iVar1;
  DeviceAPIManager *this;
  DeviceAPI *pDVar2;
  undefined4 extraout_var;
  
  this = tvm::runtime::DeviceAPIManager::Global();
  pDVar2 = tvm::runtime::DeviceAPIManager::GetAPI(this,device_type,false);
  iVar1 = (*pDVar2->_vptr_DeviceAPI[7])(pDVar2,CONCAT44(device_id,device_type));
  *out = (TVMStreamHandle)CONCAT44(extraout_var,iVar1);
  return 0;
}

Assistant:

int TVMStreamCreate(int device_type, int device_id, TVMStreamHandle* out) {
  API_BEGIN();
  TVMContext ctx;
  ctx.device_type = static_cast<DLDeviceType>(device_type);
  ctx.device_id = device_id;
  *out = DeviceAPIManager::Get(ctx)->CreateStream(ctx);
  API_END();
}